

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::asio_service_impl::stop(asio_service_impl *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1L>_> local_18;
  
  LOCK();
  bVar2 = (this->continue_).super___atomic_base<int>._M_i == 1;
  if (bVar2) {
    (this->continue_).super___atomic_base<int>._M_i = 0;
  }
  UNLOCK();
  if (bVar2) {
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->stopping_lock_);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->asio_timer_);
    LOCK();
    bVar2 = (this->stopping_status_).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar2) {
      (this->stopping_status_).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    if (bVar2) {
      local_18.__r = 1;
      std::condition_variable::wait_for<long,std::ratio<1l,1l>>(&this->stopping_cv_,&lock,&local_18)
      ;
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  LOCK();
  (this->stopping_status_).super___atomic_base<unsigned_char>._M_i = '\x01';
  UNLOCK();
  asio::io_context::stop(&this->io_svc_);
  while (bVar2 = asio::io_context::stopped(&this->io_svc_), !bVar2) {
    sched_yield();
  }
  p_Var1 = (_List_node_base *)&this->worker_handles_;
  while (p_Var1 = (((_List_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->worker_handles_) {
    if ((p_Var1[1]._M_next != (_List_node_base *)0x0) && (*(long *)p_Var1[1]._M_next != 0)) {
      std::thread::join();
    }
  }
  return;
}

Assistant:

void asio_service_impl::stop() {
    int running = 1;
    if (continue_.compare_exchange_strong(running, 0)) {
        std::unique_lock<std::mutex> lock(stopping_lock_);
        asio_timer_.cancel();

        uint8_t exp = 0;
        if (stopping_status_.compare_exchange_strong(exp, 1)) {
            // 0 means that timer_handler() is not yet called.
            // make it 1, timer_handler() will call notify().
            stopping_cv_.wait_for(lock, std::chrono::seconds(1));
        }
    }

    // Stop all workers.
    stopping_status_ = 1;

    io_svc_.stop();
    while (!io_svc_.stopped()) {
        std::this_thread::yield();
    }

    for (ptr<std::thread>& t: worker_handles_) {
        if (t && t->joinable()) {
            t->join();
        }
    }
}